

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::RunCMakeAndTest(cmCTestBuildAndTestHandler *this,string *outstring)

{
  cmCTest *pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  cmGlobalGenerator *pcVar6;
  pointer pcVar7;
  bool collapse;
  size_t k_1;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  size_t k;
  pointer pbVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  int local_6fc;
  int retval;
  double local_6e8;
  string *local_6e0;
  string outs;
  string fullPath;
  string cwd;
  cmCTestBuildAndTestCaptureRAII captureRAII;
  string resultingConfig;
  vector<const_char_*,_std::allocator<const_char_*>_> testCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths;
  char *local_5f8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_5b8;
  string cmakeOutString;
  string fullPath_1;
  ostringstream out;
  cmake cm;
  
  if ((this->BuildGenerator)._M_string_length == 0) {
    if (outstring == (string *)0x0) {
      return 1;
    }
    std::__cxx11::string::assign((char *)outstring);
    return 1;
  }
  cmake::cmake(&cm);
  std::__cxx11::string::string((string *)&out,"",(allocator *)&fullPath_1);
  cmake::SetHomeDirectory(&cm,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::string((string *)&out,"",(allocator *)&fullPath_1);
  cmake::SetHomeOutputDirectory(&cm,(string *)&out);
  std::__cxx11::string::~string((string *)&out);
  cmakeOutString._M_dataplus._M_p = (pointer)&cmakeOutString.field_2;
  cmakeOutString._M_string_length = 0;
  cmakeOutString.field_2._M_local_buf[0] = '\0';
  cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII(&captureRAII,&cm,&cmakeOutString);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if ((psVar4->_M_string_length == 0) && ((this->ConfigSample)._M_string_length != 0)) {
    fullPath_1._M_dataplus._M_p = (pointer)&fullPath_1.field_2;
    fullPath_1._M_string_length = 0;
    cwd._M_dataplus._M_p = (pointer)&cwd.field_2;
    cwd._M_string_length = 0;
    fullPath_1.field_2._M_local_buf[0] = '\0';
    cwd.field_2._M_local_buf[0] = '\0';
    resultingConfig.field_2._M_allocated_capacity = 0;
    outs.field_2._M_allocated_capacity = 0;
    resultingConfig._M_dataplus._M_p = (pointer)0x0;
    resultingConfig._M_string_length = 0;
    outs._M_dataplus._M_p = (pointer)0x0;
    outs._M_string_length = 0;
    cmCTestTestHandler::FindExecutable
              (&fullPath,(this->super_cmCTestGenericHandler).CTest,
               (this->ConfigSample)._M_dataplus._M_p,&cwd,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&resultingConfig,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outs);
    std::__cxx11::string::operator=((string *)&fullPath_1,(string *)&fullPath);
    std::__cxx11::string::~string((string *)&fullPath);
    if ((fullPath_1._M_string_length != 0) && (cwd._M_string_length != 0)) {
      cmCTest::SetConfigType((this->super_cmCTestGenericHandler).CTest,cwd._M_dataplus._M_p);
    }
    poVar5 = std::operator<<((ostream *)&out,"Using config sample with results: ");
    poVar5 = std::operator<<(poVar5,(string *)&fullPath_1);
    poVar5 = std::operator<<(poVar5," and ");
    poVar5 = std::operator<<(poVar5,(string *)&cwd);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&outs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resultingConfig);
    std::__cxx11::string::~string((string *)&cwd);
    std::__cxx11::string::~string((string *)&fullPath_1);
  }
  dVar13 = cmsys::SystemTools::GetTime();
  local_6fc = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&cwd,(SystemTools *)0x1,collapse);
  poVar5 = std::operator<<((ostream *)&out,"Internal cmake changing into directory: ");
  local_6e0 = &this->BinaryDir;
  poVar5 = std::operator<<(poVar5,(string *)local_6e0);
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar2 = cmsys::SystemTools::FileIsDirectory(local_6e0);
  if (!bVar2) {
    cmsys::SystemTools::MakeDirectory((local_6e0->_M_dataplus)._M_p);
  }
  cmsys::SystemTools::ChangeDirectory(local_6e0);
  if (this->BuildNoCMake == true) {
    pcVar6 = cmake::CreateGlobalGenerator(&cm,&this->BuildGenerator);
    cmake::SetGlobalGenerator(&cm,pcVar6);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorPlatform);
    std::__cxx11::string::_M_assign((string *)&cm.GeneratorToolset);
    cmake::LoadCache(&cm,local_6e0);
  }
  else {
    iVar3 = RunCMake(this,outstring,&out,&cmakeOutString,&cwd,&cm);
    if (iVar3 != 0) goto LAB_002ad9ce;
  }
  pbVar11 = (this->BuildTargets).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar11 ==
      (this->BuildTargets).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&fullPath_1,"",(allocator *)&fullPath);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->BuildTargets,&fullPath_1);
    std::__cxx11::string::~string((string *)&fullPath_1);
    pbVar11 = (this->BuildTargets).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  do {
    if (pbVar11 ==
        (this->BuildTargets).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (outstring != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
        std::__cxx11::string::~string((string *)&fullPath_1);
      }
      if ((this->TestCommand)._M_string_length == 0) {
        local_6fc = 0;
      }
      else {
        fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
        fullPath._M_string_length = 0;
        fullPath.field_2._M_local_buf[0] = '\0';
        resultingConfig._M_dataplus._M_p = (pointer)&resultingConfig.field_2;
        resultingConfig._M_string_length = 0;
        resultingConfig.field_2._M_allocated_capacity =
             resultingConfig.field_2._M_allocated_capacity & 0xffffffffffffff00;
        extraPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        extraPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        extraPaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((this->ExecutableDirectory)._M_string_length != 0) {
          std::__cxx11::string::string((string *)&fullPath_1,(string *)&this->ExecutableDirectory);
          std::__cxx11::string::append((char *)&fullPath_1);
          std::__cxx11::string::append((string *)&fullPath_1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&extraPaths,&fullPath_1);
          std::__cxx11::string::~string((string *)&fullPath_1);
        }
        failed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        failed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        failed.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cmCTestTestHandler::FindExecutable
                  (&fullPath_1,(this->super_cmCTestGenericHandler).CTest,
                   (this->TestCommand)._M_dataplus._M_p,&resultingConfig,&extraPaths,&failed);
        std::__cxx11::string::operator=((string *)&fullPath,(string *)&fullPath_1);
        std::__cxx11::string::~string((string *)&fullPath_1);
        bVar2 = cmsys::SystemTools::FileExists(fullPath._M_dataplus._M_p);
        if (bVar2) {
          testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          fullPath_1._M_dataplus = fullPath._M_dataplus;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                     (char **)&fullPath_1);
          lVar10 = 0;
          for (uVar12 = 0;
              pbVar11 = (this->TestCommandArgs).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              uVar12 < (ulong)((long)(this->TestCommandArgs).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5
                              ); uVar12 = uVar12 + 1) {
            fullPath_1._M_dataplus._M_p = *(pointer *)((long)&(pbVar11->_M_dataplus)._M_p + lVar10);
            std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                      ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                       (char **)&fullPath_1);
            lVar10 = lVar10 + 0x20;
          }
          fullPath_1._M_dataplus._M_p = (pointer)0x0;
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&testCommand,
                     (char **)&fullPath_1);
          outs._M_dataplus._M_p = (pointer)&outs.field_2;
          outs._M_string_length = 0;
          retval = 0;
          outs.field_2._M_allocated_capacity =
               outs.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if ((this->BuildRunDir)._M_string_length != 0) {
            poVar5 = std::operator<<((ostream *)&out,"Run test in directory: ");
            poVar5 = std::operator<<(poVar5,(string *)&this->BuildRunDir);
            std::operator<<(poVar5,"\n");
            cmsys::SystemTools::ChangeDirectory(&this->BuildRunDir);
          }
          poVar5 = std::operator<<((ostream *)&out,"Running test command: \"");
          poVar5 = std::operator<<(poVar5,(string *)&fullPath);
          std::operator<<(poVar5,"\"");
          lVar10 = 0;
          for (uVar12 = 0;
              uVar12 < (ulong)((long)(this->TestCommandArgs).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->TestCommandArgs).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar12 = uVar12 + 1) {
            poVar5 = std::operator<<((ostream *)&out," \"");
            poVar5 = std::operator<<(poVar5,(string *)
                                            ((long)&(((this->TestCommandArgs).
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar10));
            std::operator<<(poVar5,"\"");
            lVar10 = lVar10 + 0x20;
          }
          std::operator<<((ostream *)&out,"\n");
          local_6e8 = this->Timeout;
          dVar14 = 0.0;
          if (local_6e8 <= 0.0) {
LAB_002ad73e:
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            local_6e8 = dVar14;
            std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_5b8,
                       &testCommand);
            iVar3 = cmCTest::RunTest(pcVar1,(vector<const_char_*,_std::allocator<const_char_*>_> *)
                                            &local_5b8,&outs,&retval,(ostream *)0x0,local_6e8,
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)0x0);
            std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                      (&local_5b8);
            if ((iVar3 != 4) || (retval != 0)) {
              poVar5 = std::operator<<((ostream *)&out,"Test command failed: ");
              poVar5 = std::operator<<(poVar5,*testCommand.
                                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              std::operator<<(poVar5,"\n");
              retval = 1;
            }
            poVar5 = std::operator<<((ostream *)&out,(string *)&outs);
            std::operator<<(poVar5,"\n");
            if (outstring == (string *)0x0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
              std::__cxx11::stringbuf::str();
              poVar5 = std::operator<<((ostream *)&fullPath_1,(string *)local_5f8);
              std::endl<char,std::char_traits<char>>(poVar5);
              std::__cxx11::string::~string((string *)local_5f8);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                           ,0x1b2,local_5f8[0],false);
              std::__cxx11::string::~string((string *)local_5f8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
            }
            else {
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
              std::__cxx11::string::~string((string *)&fullPath_1);
            }
            local_6fc = retval;
          }
          else {
            dVar14 = cmsys::SystemTools::GetTime();
            dVar14 = dVar13 + (local_6e8 - dVar14);
            if (0.0 < dVar14) goto LAB_002ad73e;
            local_6fc = 1;
            if (outstring != (string *)0x0) {
              std::__cxx11::string::assign((char *)outstring);
            }
          }
          std::__cxx11::string::~string((string *)&outs);
          std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                    (&testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
        }
        else {
          poVar5 = std::operator<<((ostream *)&out,
                                   "Could not find path to executable, perhaps it was not built: ");
          poVar5 = std::operator<<(poVar5,(string *)&this->TestCommand);
          std::operator<<(poVar5,"\n");
          std::operator<<((ostream *)&out,"tried to find it in these places:\n");
          poVar5 = std::operator<<((ostream *)&out,fullPath._M_dataplus._M_p);
          std::operator<<(poVar5,"\n");
          for (uVar9 = 0;
              (ulong)uVar9 <
              (ulong)((long)failed.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)failed.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
            poVar5 = std::operator<<((ostream *)&out,
                                     (string *)
                                     (failed.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar9));
            std::operator<<(poVar5,"\n");
          }
          if (outstring == (string *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullPath_1);
            std::__cxx11::stringbuf::str();
            std::operator<<((ostream *)&fullPath_1,(string *)&outs);
            std::__cxx11::string::~string((string *)&outs);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar1,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                         ,0x176,outs._M_dataplus._M_p,false);
            std::__cxx11::string::~string((string *)&outs);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullPath_1);
          }
          else {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath_1);
            std::__cxx11::string::~string((string *)&fullPath_1);
          }
          cmsys::SystemTools::ChangeDirectory(&cwd);
          local_6fc = 1;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&failed);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&extraPaths);
        std::__cxx11::string::~string((string *)&resultingConfig);
        std::__cxx11::string::~string((string *)&fullPath);
      }
      break;
    }
    local_6e8 = this->Timeout;
    dVar14 = 0.0;
    if (0.0 < local_6e8) {
      dVar14 = cmsys::SystemTools::GetTime();
      dVar14 = (local_6e8 - dVar14) + dVar13;
      if (dVar14 <= 0.0) {
        if (outstring != (string *)0x0) {
          std::__cxx11::string::assign((char *)outstring);
        }
        break;
      }
    }
    fullPath_1._M_dataplus._M_p = (pointer)&fullPath_1.field_2;
    fullPath_1._M_string_length = 0;
    fullPath_1.field_2._M_local_buf[0] = '\0';
    local_6e8 = dVar14;
    psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    if (psVar4->_M_string_length == 0) {
      pcVar7 = (pointer)0x0;
    }
    else {
      psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
      pcVar7 = (psVar4->_M_dataplus)._M_p;
    }
    pcVar6 = cm.GlobalGenerator;
    pcVar8 = "Debug";
    if (pcVar7 != (pointer)0x0) {
      pcVar8 = pcVar7;
    }
    std::__cxx11::string::string((string *)&fullPath,pcVar8,(allocator *)&outs);
    resultingConfig._M_dataplus._M_p = (pointer)0x0;
    resultingConfig._M_string_length = 0;
    resultingConfig.field_2._M_allocated_capacity = 0;
    iVar3 = cmGlobalGenerator::Build
                      (pcVar6,&this->SourceDir,local_6e0,&this->BuildProject,pbVar11,&fullPath_1,
                       &this->BuildMakeProgram,&fullPath,(bool)(this->BuildNoClean ^ 1),false,false,
                       local_6e8,OUTPUT_NONE,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&resultingConfig);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&resultingConfig);
    std::__cxx11::string::~string((string *)&fullPath);
    std::operator<<((ostream *)&out,(string *)&fullPath_1);
    if ((outstring != (string *)0x0) && (iVar3 != 0)) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)outstring,(string *)&fullPath);
      std::__cxx11::string::~string((string *)&fullPath);
    }
    std::__cxx11::string::~string((string *)&fullPath_1);
    pbVar11 = pbVar11 + 1;
  } while (iVar3 == 0);
LAB_002ad9ce:
  std::__cxx11::string::~string((string *)&cwd);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  cmCTestBuildAndTestCaptureRAII::~cmCTestBuildAndTestCaptureRAII(&captureRAII);
  std::__cxx11::string::~string((string *)&cmakeOutString);
  cmake::~cmake(&cm);
  return local_6fc;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMakeAndTest(std::string* outstring)
{
  // if the generator and make program are not specified then it is an error
  if (this->BuildGenerator.empty())
    {
    if(outstring)
      {
      *outstring =
        "--build-and-test requires that the generator "
        "be provided using the --build-generator "
        "command line option. ";
      }
    return 1;
    }

  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  std::string cmakeOutString;
  cmCTestBuildAndTestCaptureRAII captureRAII(cm, cmakeOutString);
  static_cast<void>(captureRAII);
  std::ostringstream out;

  if ( this->CTest->GetConfigType().empty() &&
       !this->ConfigSample.empty())
    {
    // use the config sample to set the ConfigType
    std::string fullPath;
    std::string resultingConfig;
    std::vector<std::string> extraPaths;
    std::vector<std::string> failed;
    fullPath =
      cmCTestTestHandler::FindExecutable(this->CTest,
                                         this->ConfigSample.c_str(),
                                         resultingConfig,
                                         extraPaths,
                                         failed);
    if (!fullPath.empty() && !resultingConfig.empty())
      {
      this->CTest->SetConfigType(resultingConfig.c_str());
      }
    out << "Using config sample with results: "
        << fullPath << " and " << resultingConfig << std::endl;
    }

  // we need to honor the timeout specified, the timeout include cmake, build
  // and test time
  double clock_start = cmSystemTools::GetTime();

  // make sure the binary dir is there
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  out << "Internal cmake changing into directory: "
    << this->BinaryDir << std::endl;
  if (!cmSystemTools::FileIsDirectory(this->BinaryDir))
    {
    cmSystemTools::MakeDirectory(this->BinaryDir.c_str());
    }
  cmSystemTools::ChangeDirectory(this->BinaryDir);

  if(this->BuildNoCMake)
    {
    // Make the generator available for the Build call below.
    cm.SetGlobalGenerator(cm.CreateGlobalGenerator(
                            this->BuildGenerator));
    cm.SetGeneratorPlatform(this->BuildGeneratorPlatform);
    cm.SetGeneratorToolset(this->BuildGeneratorToolset);

    // Load the cache to make CMAKE_MAKE_PROGRAM available.
    cm.LoadCache(this->BinaryDir);
    }
  else
    {
    // do the cmake step, no timeout here since it is not a sub process
    if (this->RunCMake(outstring,out,cmakeOutString,cwd,&cm))
      {
      return 1;
      }
    }

  // do the build
  std::vector<std::string>::iterator tarIt;
  if (this->BuildTargets.empty())
    {
    this->BuildTargets.push_back("");
    }
  for ( tarIt = this->BuildTargets.begin();
        tarIt != this->BuildTargets.end(); ++ tarIt )
    {
    double remainingTime = 0;
    if (this->Timeout > 0)
      {
      remainingTime = this->Timeout - cmSystemTools::GetTime() + clock_start;
      if (remainingTime <= 0)
        {
        if(outstring)
          {
          *outstring = "--build-and-test timeout exceeded. ";
          }
        return 1;
        }
      }
    std::string output;
    const char* config = 0;
    if (!this->CTest->GetConfigType().empty())
      {
      config = this->CTest->GetConfigType().c_str();
      }
#ifdef CMAKE_INTDIR
    if(!config)
      {
      config = CMAKE_INTDIR;
      }
#endif
    if(!config)
      {
      config = "Debug";
      }
    int retVal = cm.GetGlobalGenerator()->Build(
      this->SourceDir, this->BinaryDir,
      this->BuildProject, *tarIt,
      output, this->BuildMakeProgram,
      config,
      !this->BuildNoClean,
      false, false, remainingTime);
    out << output;
    // if the build failed then return
    if (retVal)
      {
      if(outstring)
        {
        *outstring =  out.str();
        }
      return 1;
      }
    }
  if(outstring)
    {
    *outstring =  out.str();
    }

  // if no test was specified then we are done
  if (this->TestCommand.empty())
    {
    return 0;
    }

  // now run the compiled test if we can find it
  // store the final location in fullPath
  std::string fullPath;
  std::string resultingConfig;
  std::vector<std::string> extraPaths;
  // if this->ExecutableDirectory is set try that as well
  if (!this->ExecutableDirectory.empty())
    {
    std::string tempPath = this->ExecutableDirectory;
    tempPath += "/";
    tempPath += this->TestCommand;
    extraPaths.push_back(tempPath);
    }
  std::vector<std::string> failed;
  fullPath =
    cmCTestTestHandler::FindExecutable(this->CTest,
                                       this->TestCommand.c_str(),
                                       resultingConfig,
                                       extraPaths,
                                       failed);

  if(!cmSystemTools::FileExists(fullPath.c_str()))
    {
    out << "Could not find path to executable, perhaps it was not built: "
      << this->TestCommand << "\n";
    out << "tried to find it in these places:\n";
    out << fullPath.c_str() << "\n";
    for(unsigned int i=0; i < failed.size(); ++i)
      {
      out << failed[i] << "\n";
      }
    if(outstring)
      {
      *outstring =  out.str();
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
      }
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    return 1;
    }

  std::vector<const char*> testCommand;
  testCommand.push_back(fullPath.c_str());
  for(size_t k=0; k < this->TestCommandArgs.size(); ++k)
    {
    testCommand.push_back(this->TestCommandArgs[k].c_str());
    }
  testCommand.push_back(0);
  std::string outs;
  int retval = 0;
  // run the test from the this->BuildRunDir if set
  if(!this->BuildRunDir.empty())
    {
    out << "Run test in directory: " << this->BuildRunDir << "\n";
    cmSystemTools::ChangeDirectory(this->BuildRunDir);
    }
  out << "Running test command: \"" << fullPath << "\"";
  for(size_t k=0; k < this->TestCommandArgs.size(); ++k)
    {
    out << " \"" << this->TestCommandArgs[k] << "\"";
    }
  out << "\n";

  // how much time is remaining
  double remainingTime = 0;
  if (this->Timeout > 0)
    {
    remainingTime = this->Timeout - cmSystemTools::GetTime() + clock_start;
    if (remainingTime <= 0)
      {
      if(outstring)
        {
        *outstring = "--build-and-test timeout exceeded. ";
        }
      return 1;
      }
    }

  int runTestRes = this->CTest->RunTest(testCommand, &outs, &retval, 0,
                                        remainingTime, 0);

  if(runTestRes != cmsysProcess_State_Exited || retval != 0)
    {
    out << "Test command failed: " << testCommand[0] << "\n";
    retval = 1;
    }

  out << outs << "\n";
  if(outstring)
    {
    *outstring = out.str();
    }
  else
    {
    cmCTestLog(this->CTest, OUTPUT, out.str() << std::endl);
    }
  return retval;
}